

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O1

BigNumber *
montgomery(BigNumber *__return_storage_ptr__,BigNumber *a,BigNumber *b,BigNumber *n,int r,
          BigNumber *v)

{
  pointer *ppuVar1;
  pointer __dest;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  BigNumber t;
  BigNumber s;
  BigNumber m;
  BigNumber resultat_1;
  BigNumber local_1b0;
  BigNumber local_190;
  BigNumber local_170;
  BigNumber local_150;
  BigNumber local_130;
  BigNumber local_110;
  BigNumber local_f0;
  BigNumber local_d0;
  BigNumber local_b0;
  BigNumber local_90;
  BigNumber local_70;
  BigNumber local_50;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)a);
  local_50.m_base = a->m_base;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)b);
  local_70.m_base = b->m_base;
  partial_multiplication
            (&local_190,&local_50,&local_70,
             (uint)((ulong)((long)local_50.super_Polynome.m_coef.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_50.super_Polynome.m_coef.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 1) | 1);
  if (local_70.super_Polynome.m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_50.super_Polynome.m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  partial_multiplication(&local_1b0,&local_190,v,r);
  BigNumber::m_mask(&local_1b0,r);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_110,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_190);
  local_110.m_base = local_190.m_base;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_130,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1b0);
  local_130.m_base = local_1b0.m_base;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)n);
  local_b0.m_base = n->m_base;
  partial_multiplication
            (&local_90,&local_130,&local_b0,
             (uint)((ulong)((long)local_130.super_Polynome.m_coef.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_130.super_Polynome.m_coef.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 1) | 1);
  operator+(&local_f0,&local_110,&local_90);
  if (local_90.super_Polynome.m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.super_Polynome.m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_130.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_110.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f0);
  __return_storage_ptr__->m_base = local_f0.m_base;
  if (0 < r) {
    do {
      __dest = (__return_storage_ptr__->super_Polynome).m_coef.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (__return_storage_ptr__->super_Polynome).m_coef.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar3 = __dest + 1;
      if (puVar3 != puVar2) {
        memmove(__dest,puVar3,(long)puVar2 - (long)puVar3);
      }
      ppuVar1 = &(__return_storage_ptr__->super_Polynome).m_coef.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + -1;
      r = r + -1;
    } while (r != 0);
  }
  bVar4 = operator>(__return_storage_ptr__,n);
  if (!bVar4) {
    bVar4 = operator==(__return_storage_ptr__,n);
    if (!bVar4) goto LAB_00102f99;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_170,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__);
  local_170.m_base = __return_storage_ptr__->m_base;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)n);
  local_d0.m_base = n->m_base;
  operator-(&local_150,&local_170,&local_d0);
  __return_storage_ptr__->m_base = local_150.m_base;
  puVar3 = (__return_storage_ptr__->super_Polynome).m_coef.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((__return_storage_ptr__->super_Polynome).m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (__return_storage_ptr__->super_Polynome).m_coef.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar3;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_150);
  if (local_150.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_150.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d0.super_Polynome.m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_170.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_170.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_00102f99:
  if (local_f0.super_Polynome.m_coef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1b0.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b0.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_190.super_Polynome.m_coef.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.super_Polynome.m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_190.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.super_Polynome.m_coef.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

BigNumber montgomery(BigNumber &a, BigNumber &b, BigNumber &n, int r, BigNumber &v){

//    clock_t t1, t2;
//    static clock_t t_tmp;
//    static unsigned int cmp = 0;
//    t1 = clock();

    BigNumber s = a*b;
    //BigNumber t = s*v;
    BigNumber t = partial_multiplication(s, v, r);
    t.m_mask(r);
    BigNumber m = s + t*n;
    BigNumber u = m;

    u << r;
    if(u >= n){
        u = u - n;
    }
//    t2 = clock();
//    t_tmp += (t2 - t1);
//    cmp += 1;
//    cout << " Montgomery : " << t_tmp/(float)cmp << endl;
    return u;

}